

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

int baryonyx::itm::
    compute_violated_constraints<baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>,baryonyx::bit_array>
              (solver_equalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
               *slv,bit_array *x,vector<int,_std::allocator<int>_> *out)

{
  pointer piVar1;
  bool bVar2;
  undefined8 in_RAX;
  int k;
  undefined8 uStack_28;
  
  piVar1 = (out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
      != piVar1) {
    (out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
         piVar1;
  }
  k = 0;
  uStack_28 = in_RAX;
  while (uStack_28 = CONCAT44(k,(undefined4)uStack_28), k != slv->m) {
    bVar2 = is_valid_constraint<baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>,baryonyx::bit_array>
                      (slv,k,x);
    if (!bVar2) {
      std::vector<int,std::allocator<int>>::emplace_back<int&>
                ((vector<int,std::allocator<int>> *)out,(int *)((long)&uStack_28 + 4));
    }
    k = uStack_28._4_4_ + 1;
  }
  return (int)((ulong)((long)(out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start) >> 2);
}

Assistant:

int
compute_violated_constraints(const Solver& slv,
                             const Xtype& x,
                             std::vector<int>& out)
{
    out.clear();

    for (int k = 0; k != slv.m; ++k)
        if (!is_valid_constraint(slv, k, x))
            out.emplace_back(k);

    return length(out);
}